

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin2psf1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__src;
  uint32_t initial_sp_00;
  int iVar1;
  uint32_t load_address_00;
  uint32_t initial_pc_00;
  int *piVar2;
  bool bVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_11b0;
  undefined1 local_1180 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  uint32_t initial_sp;
  uint32_t initial_pc;
  uint32_t load_address;
  char *bin_path;
  char region [256];
  char psf_path [4096];
  char *local_30;
  char *strtol_endp;
  unsigned_long ulvalue;
  int argi;
  int argnum;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _argi = argv;
  argv_local._0_4_ = argc;
  memset(region + 0xf8,0,0x1000);
  memset(&bin_path,0,0x100);
  ulvalue._0_4_ = 1;
  while( true ) {
    bVar3 = false;
    if ((int)ulvalue < (int)argv_local) {
      bVar3 = *_argi[(int)ulvalue] == '-';
    }
    if (!bVar3) break;
    iVar1 = strcmp(_argi[(int)ulvalue],"--help");
    if (iVar1 == 0) {
      printUsage(*_argi);
      return 0;
    }
    iVar1 = strcmp(_argi[(int)ulvalue],"-o");
    if ((iVar1 == 0) || (iVar1 = strcmp(_argi[(int)ulvalue],"--out-filename"), iVar1 == 0)) {
      if ((int)argv_local <= (int)ulvalue + 1) {
        fprintf(_stderr,"Error: Too few arguments for \"%s\".\n",_argi[(int)ulvalue]);
        return 1;
      }
      strcpy(region + 0xf8,_argi[(int)ulvalue + 1]);
    }
    else {
      iVar1 = strcmp(_argi[(int)ulvalue],"-r");
      if ((iVar1 != 0) && (iVar1 = strcmp(_argi[(int)ulvalue],"--region"), iVar1 != 0)) {
        fprintf(_stderr,"Error: Unknown option \"%s\"\n",_argi[(int)ulvalue]);
        return 1;
      }
      if ((int)argv_local <= (int)ulvalue + 1) {
        fprintf(_stderr,"Error: Too few arguments for \"%s\".\n",_argi[(int)ulvalue]);
        return 1;
      }
      strcpy((char *)&bin_path,_argi[(int)ulvalue + 1]);
    }
    ulvalue._0_4_ = (int)ulvalue + 2;
  }
  ulvalue._4_4_ = (int)argv_local - (int)ulvalue;
  if (ulvalue._4_4_ != 4) {
    fprintf(_stderr,"Error: Too few/more arguments.\n");
    fprintf(_stderr,"\n");
    fprintf(_stderr,"Run \"%s --help\" for help.\n",*_argi);
    return 1;
  }
  __src = _argi[(int)ulvalue];
  if (region[0xf8] == '\0') {
    strcpy(region + 0xf8,__src);
    path_stripext(region + 0xf8);
    strcat(region + 0xf8,".psf");
  }
  strtol_endp = (char *)strtoul(_argi[(int)ulvalue + 1],&local_30,0x10);
  if ((*local_30 == '\0') && (piVar2 = __errno_location(), *piVar2 != 0x22)) {
    load_address_00 = (uint32_t)strtol_endp;
    strtol_endp = (char *)strtoul(_argi[(int)ulvalue + 2],&local_30,0x10);
    if ((*local_30 != '\0') || (piVar2 = __errno_location(), *piVar2 == 0x22)) {
      fprintf(_stderr,"Error: Number format error \"%s\"\n",_argi[(int)ulvalue + 2]);
      return 1;
    }
    initial_pc_00 = (uint32_t)strtol_endp;
    strtol_endp = (char *)strtoul(_argi[(int)ulvalue + 3],&local_30,0x10);
    if ((*local_30 == '\0') && (piVar2 = __errno_location(), *piVar2 != 0x22)) {
      tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (uint32_t)strtol_endp;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1180);
      initial_sp_00 = tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&local_11b0,
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1180);
      bVar3 = bin2psf1(__src,region + 0xf8,load_address_00,initial_pc_00,initial_sp_00,
                       (char *)&bin_path,&local_11b0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map(&local_11b0);
      bVar3 = ((bVar3 ^ 0xffU) & 1) != 0;
      if (bVar3) {
        fprintf(_stderr,"Error: Unable to convert to PSF1 format\n");
      }
      argv_local._4_4_ = (uint)bVar3;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1180);
      return argv_local._4_4_;
    }
    fprintf(_stderr,"Error: Number format error \"%s\"\n",_argi[(int)ulvalue + 3]);
    return 1;
  }
  fprintf(_stderr,"Error: Number format error \"%s\"\n",_argi[(int)ulvalue + 1]);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
	int argnum;
	int argi;

	unsigned long ulvalue;
	char * strtol_endp;

	char psf_path[PATH_MAX] = { '\0' };

	char region[256] = { '\0' };

	argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			printUsage(argv[0]);
			return EXIT_SUCCESS;
		}
		else if (strcmp(argv[argi], "-o") == 0 || strcmp(argv[argi], "--out-filename") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\".\n", argv[argi]);
				return EXIT_FAILURE;
			}
			strcpy(psf_path, argv[argi + 1]);
			argi++;
		}
		else if (strcmp(argv[argi], "-r") == 0 || strcmp(argv[argi], "--region") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\".\n", argv[argi]);
				return EXIT_FAILURE;
			}
			strcpy(region, argv[argi + 1]);
			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	argnum = argc - argi;
	if (argnum != 4) {
		fprintf(stderr, "Error: Too few/more arguments.\n");
		fprintf(stderr, "\n");
		fprintf(stderr, "Run \"%s --help\" for help.\n", argv[0]);
		return EXIT_FAILURE;
	}

	char * bin_path = argv[argi];

	if (psf_path[0] == '\0') {
		strcpy(psf_path, bin_path);
		path_stripext(psf_path);
		strcat(psf_path, ".psf");
	}

	ulvalue = strtoul(argv[argi + 1], &strtol_endp, 16);
	if (*strtol_endp != '\0' || errno == ERANGE) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
		return EXIT_FAILURE;
	}
	uint32_t load_address = ulvalue;

	ulvalue = strtoul(argv[argi + 2], &strtol_endp, 16);
	if (*strtol_endp != '\0' || errno == ERANGE) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 2]);
		return EXIT_FAILURE;
	}
	uint32_t initial_pc = ulvalue;

	ulvalue = strtoul(argv[argi + 3], &strtol_endp, 16);
	if (*strtol_endp != '\0' || errno == ERANGE) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 3]);
		return EXIT_FAILURE;
	}
	uint32_t initial_sp = ulvalue;

	std::map<std::string, std::string> tags;
	if (!bin2psf1(bin_path, psf_path, load_address, initial_pc, initial_sp, region, tags)) {
		fprintf(stderr, "Error: Unable to convert to PSF1 format\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}